

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O0

string * __thiscall
sf2cute::RIFFChunk::name_abi_cxx11_(string *__return_storage_ptr__,RIFFChunk *this)

{
  RIFFChunk *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const override {
    return name_;
  }